

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFacetedBrepWithVoids::~IfcFacetedBrepWithVoids
          (IfcFacetedBrepWithVoids *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
                   super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcFacetedBrepWithVoids_00893348;
  *(undefined ***)(&this->field_0x70 + (long)p_Var2) = &PTR__IfcFacetedBrepWithVoids_00893410;
  *(undefined ***)
   (&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = &PTR__IfcFacetedBrepWithVoids_00893370;
  *(undefined ***)
   (&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = &PTR__IfcFacetedBrepWithVoids_00893398;
  *(undefined ***)
   (&(this->super_IfcManifoldSolidBrep).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
     field_0x30 + (long)p_Var2) = &PTR__IfcFacetedBrepWithVoids_008933c0;
  *(undefined ***)(&(this->super_IfcManifoldSolidBrep).field_0x48 + (long)p_Var2) =
       &PTR__IfcFacetedBrepWithVoids_008933e8;
  pvVar3 = *(void **)(&(this->super_IfcManifoldSolidBrep).field_0x58 + (long)p_Var2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x68) - (long)pvVar3);
  }
  operator_delete(p_Var1,0x88);
  return;
}

Assistant:

IfcFacetedBrepWithVoids() : Object("IfcFacetedBrepWithVoids") {}